

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O1

bool __thiscall
Assimp::Ogre::OgreImporter::ReadTextureUnit
          (OgreImporter *this,string *textureUnitName,stringstream *ss,aiMaterial *material)

{
  uint index;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  aiMaterial *this_00;
  char cVar4;
  int iVar5;
  Logger *pLVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  mapped_type *pmVar10;
  long *plVar11;
  size_type *psVar12;
  bool bVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  size_type sVar16;
  long lVar17;
  size_t sVar18;
  aiTextureType textureType;
  string identifier;
  int uvCoord;
  string partTexture;
  string linePart;
  string textureRef;
  string partTextCoordSet;
  string partColorOp;
  aiString assimpTextureRef;
  key_type local_59c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  int local_574;
  long *local_570;
  size_t local_568;
  long local_560 [2];
  undefined1 *local_550;
  size_t local_548;
  undefined1 local_540;
  undefined7 uStack_53f;
  OgreImporter *local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  string *local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_500;
  long local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4e0;
  size_type local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  long *local_4c0;
  size_t local_4b8;
  long local_4b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4a0;
  undefined8 local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  aiMaterial *local_480;
  long *local_478;
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  undefined1 local_438 [24];
  long lStack_420;
  ios_base local_3c8 [920];
  
  local_550 = &local_540;
  local_548 = 0;
  local_540 = 0;
  local_508 = textureUnitName;
  local_480 = material;
  std::operator>>((istream *)ss,(string *)&local_550);
  if ((local_548 == DAT_00903140) &&
     ((local_548 == 0 || (iVar5 = bcmp(local_550,partBlockStart_abi_cxx11_,local_548), iVar5 == 0)))
     ) {
    pLVar6 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[18]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
               (char (*) [18])"   texture_unit \'");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_438,(local_508->_M_dataplus)._M_p,local_508->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"\'",1);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar6,(char *)local_570);
    if (local_570 != local_560) {
      operator_delete(local_570,local_560[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    local_570 = local_560;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"texture","");
    local_4c0 = local_4b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"tex_coord_set","");
    local_458[0] = local_448;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"colour_op","");
    local_59c = aiTextureType_NONE;
    local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
    local_528._M_string_length = 0;
    local_528.field_2._M_local_buf[0] = '\0';
    local_574 = 0;
    local_530 = this;
LAB_004c4c6a:
    if ((local_548 == DAT_00903160) &&
       ((local_548 == 0 || (iVar5 = bcmp(local_550,partBlockEnd_abi_cxx11_,local_548), iVar5 == 0)))
       ) goto LAB_004c532f;
    std::operator>>((istream *)ss,(string *)&local_550);
    sVar18 = local_548;
    if ((local_548 == DAT_00903120) &&
       ((local_548 == 0 || (iVar5 = bcmp(local_550,partComment_abi_cxx11_,local_548), iVar5 == 0))))
    {
      local_498 = 0;
      local_490._M_local_buf[0] = '\0';
      local_4a0 = &local_490;
      cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)ss + -0x18) + (char)ss);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)ss,(string *)&local_4a0,cVar4);
      if (local_4a0 == &local_490) goto LAB_004c4c6a;
      uVar14 = CONCAT71(local_490._M_allocated_capacity._1_7_,local_490._M_local_buf[0]);
      _Var15._M_p = (pointer)local_4a0;
    }
    else {
      if ((sVar18 != local_568) ||
         ((sVar18 != 0 && (iVar5 = bcmp(local_550,local_570,sVar18), iVar5 != 0)))) {
        if ((sVar18 == local_4b8) &&
           ((sVar18 == 0 || (iVar5 = bcmp(local_550,local_4c0,sVar18), iVar5 == 0)))) {
          std::istream::operator>>(ss,&local_574);
        }
        goto LAB_004c4c6a;
      }
      std::operator>>((istream *)ss,(string *)&local_550);
      std::__cxx11::string::_M_assign((string *)&local_528);
      if (this->m_detectTextureTypeFromFilename != true) {
        local_500 = &local_4f0;
        pcVar1 = (local_508->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_500,pcVar1,pcVar1 + local_508->_M_string_length);
        lVar9 = local_4f8;
        paVar2 = local_500;
        if (local_4f8 != 0) {
          lVar17 = 0;
          do {
            iVar5 = tolower((int)paVar2->_M_local_buf[lVar17]);
            paVar2->_M_local_buf[lVar17] = (char)iVar5;
            lVar17 = lVar17 + 1;
          } while (lVar9 != lVar17);
        }
        local_438._0_8_ = local_438 + 0x10;
        if (local_500 == &local_4f0) {
          lStack_420 = local_4f0._8_8_;
        }
        else {
          local_438._0_8_ = local_500;
        }
        local_438._17_7_ = local_4f0._M_allocated_capacity._1_7_;
        local_438[0x10] = local_4f0._M_local_buf[0];
        local_438._8_8_ = local_4f8;
        local_4f8 = 0;
        local_4f0._M_local_buf[0] = '\0';
        local_500 = &local_4f0;
        lVar9 = std::__cxx11::string::find(local_438,0x6ea5d3,0);
        this = local_530;
        if (lVar9 == -1) {
          lVar9 = std::__cxx11::string::find(local_438,0x6ea78a,0);
          if (lVar9 == -1) {
            lVar9 = std::__cxx11::string::find(local_438,0x6ea79a,0);
            if (lVar9 == -1) {
              lVar9 = std::__cxx11::string::find(local_438,0x6ea7c7,0);
              if (lVar9 == -1) {
                local_59c = aiTextureType_DIFFUSE;
              }
              else {
                local_59c = aiTextureType_DISPLACEMENT;
              }
            }
            else {
              local_59c = aiTextureType_LIGHTMAP;
            }
          }
          else {
            local_59c = aiTextureType_SPECULAR;
          }
        }
        else {
          local_59c = aiTextureType_NORMALS;
        }
        uVar14 = local_438._16_8_;
        _Var15._M_p = (pointer)local_438._0_8_;
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) goto LAB_004c5308;
        goto LAB_004c4c6a;
      }
      uVar7 = std::__cxx11::string::find_last_of((char *)&local_528,0x6dde76,0xffffffffffffffff);
      uVar8 = std::__cxx11::string::find_last_of((char *)&local_528,0x6d681a,0xffffffffffffffff);
      if (uVar7 <= uVar8 || uVar7 == 0xffffffffffffffff) {
        local_59c = aiTextureType_DIFFUSE;
        this = local_530;
        goto LAB_004c4c6a;
      }
      std::__cxx11::string::substr((ulong)&local_4e0,(ulong)&local_528);
      sVar3 = local_4d8;
      paVar2 = local_4e0;
      if (local_4d8 != 0) {
        sVar16 = 0;
        do {
          iVar5 = tolower((int)paVar2->_M_local_buf[sVar16]);
          paVar2->_M_local_buf[sVar16] = (char)iVar5;
          sVar16 = sVar16 + 1;
        } while (sVar3 != sVar16);
      }
      local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
      if (local_4e0 == &local_4d0) {
        local_598.field_2._8_8_ = local_4d0._8_8_;
      }
      else {
        local_598._M_dataplus._M_p = (pointer)local_4e0;
      }
      local_598.field_2._M_allocated_capacity._1_7_ = local_4d0._M_allocated_capacity._1_7_;
      local_598.field_2._M_local_buf[0] = local_4d0._M_local_buf[0];
      local_598._M_string_length = local_4d8;
      local_4d8 = 0;
      local_4d0._M_local_buf[0] = '\0';
      local_4e0 = &local_4d0;
      pLVar6 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[47]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                 (char (*) [47])"Detecting texture type from filename postfix \'");
      this = local_530;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_438,local_598._M_dataplus._M_p,local_598._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"\'",1);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar6,(char *)local_478);
      if (local_478 != local_468) {
        operator_delete(local_478,local_468[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      iVar5 = std::__cxx11::string::compare((char *)&local_598);
      if (((((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0)
            ) || (iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0)) ||
          ((iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0 ||
           (iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0)))) ||
         (iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0)) {
        local_59c = aiTextureType_NORMALS;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_598);
        if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0)
            ) || ((iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0 ||
                  (iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0)))) {
          local_59c = aiTextureType_SPECULAR;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_598);
          if ((((iVar5 == 0) ||
               (iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0)) ||
              (iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0)) ||
             ((iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0 ||
              (iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0)))) {
            local_59c = aiTextureType_LIGHTMAP;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&local_598);
            if ((iVar5 == 0) ||
               (iVar5 = std::__cxx11::string::compare((char *)&local_598), iVar5 == 0)) {
              local_59c = aiTextureType_DISPLACEMENT;
            }
            else {
              local_59c = aiTextureType_DIFFUSE;
            }
          }
        }
      }
      uVar14 = local_598.field_2._M_allocated_capacity;
      _Var15._M_p = local_598._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p == &local_598.field_2) goto LAB_004c4c6a;
    }
LAB_004c5308:
    operator_delete(_Var15._M_p,uVar14 + 1);
    goto LAB_004c4c6a;
  }
  pLVar6 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[63]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
             (char (*) [63])"Invalid material: Texture unit block start missing near index ");
  std::istream::tellg();
  std::ostream::_M_insert<long>((long)local_438);
  std::__cxx11::stringbuf::str();
  Logger::error(pLVar6,(char *)local_570);
  if (local_570 != local_560) {
    operator_delete(local_570,local_560[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  bVar13 = false;
  goto LAB_004c568b;
LAB_004c532f:
  if (local_528._M_string_length == 0) {
    pLVar6 = DefaultLogger::get();
    Logger::warn(pLVar6,"Texture reference is empty, ignoring texture_unit.");
LAB_004c55fe:
    bVar13 = false;
  }
  else {
    if (local_59c == aiTextureType_NONE) {
      pLVar6 = DefaultLogger::get();
      std::operator+(&local_598,"Failed to detect texture type for \'",&local_528);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_598);
      psVar12 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_438._16_8_ = *psVar12;
        lStack_420 = plVar11[3];
        local_438._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_438 + 0x10);
      }
      else {
        local_438._16_8_ = *psVar12;
        local_438._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar11;
      }
      local_438._8_8_ = plVar11[1];
      *plVar11 = (long)psVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      Logger::warn(pLVar6,(char *)local_438._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_438 + 0x10)) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p != &local_598.field_2) {
        operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
      }
      goto LAB_004c55fe;
    }
    pmVar10 = std::
              map<aiTextureType,_unsigned_int,_std::less<aiTextureType>,_std::allocator<std::pair<const_aiTextureType,_unsigned_int>_>_>
              ::operator[](&this->m_textures,&local_59c);
    index = *pmVar10;
    pmVar10 = std::
              map<aiTextureType,_unsigned_int,_std::less<aiTextureType>,_std::allocator<std::pair<const_aiTextureType,_unsigned_int>_>_>
              ::operator[](&this->m_textures,&local_59c);
    *pmVar10 = *pmVar10 + 1;
    pLVar6 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[14]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
               (char (*) [14])"    texture \'");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_438,local_528._M_dataplus._M_p,local_528._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"\' type ",7);
    std::ostream::operator<<(local_438,local_59c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," index ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)local_438);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," UV ",4);
    std::ostream::operator<<(local_438,local_574);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar6,local_598._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    sVar18 = 0x3ff;
    if ((local_528._M_string_length & 0xfffffc00) == 0) {
      sVar18 = local_528._M_string_length & 0xffffffff;
    }
    local_438._0_4_ = (int)sVar18;
    memcpy(local_438 + 4,local_528._M_dataplus._M_p,sVar18);
    this_00 = local_480;
    local_438[sVar18 + 4] = 0;
    aiMaterial::AddProperty(local_480,(aiString *)local_438,"$tex.file",local_59c,index);
    aiMaterial::AddBinaryProperty(this_00,&local_574,4,"$tex.uvwsrc",local_59c,index,aiPTI_Integer);
    bVar13 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,
                    CONCAT71(local_528.field_2._M_allocated_capacity._1_7_,
                             local_528.field_2._M_local_buf[0]) + 1);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  if (local_4c0 != local_4b0) {
    operator_delete(local_4c0,local_4b0[0] + 1);
  }
  if (local_570 != local_560) {
    operator_delete(local_570,local_560[0] + 1);
  }
LAB_004c568b:
  if (local_550 != &local_540) {
    operator_delete(local_550,CONCAT71(uStack_53f,local_540) + 1);
  }
  return bVar13;
}

Assistant:

bool OgreImporter::ReadTextureUnit(const std::string &textureUnitName, stringstream &ss, aiMaterial *material)
{
    string linePart;
    ss >> linePart;

    if (linePart != partBlockStart)
    {
        ASSIMP_LOG_ERROR_F( "Invalid material: Texture unit block start missing near index ", ss.tellg());
        return false;
    }

    ASSIMP_LOG_DEBUG_F("   texture_unit '", textureUnitName, "'");

    const string partTexture      = "texture";
    const string partTextCoordSet = "tex_coord_set";
    const string partColorOp      = "colour_op";

    aiTextureType textureType = aiTextureType_NONE;
    std::string textureRef;
    int uvCoord = 0;

    while(linePart != partBlockEnd)
    {
        ss >> linePart;

        // Skip commented lines
        if (linePart == partComment)
        {
            SkipLine(ss);
            continue;
        }

        if (linePart == partTexture)
        {
            ss >> linePart;
            textureRef = linePart;

            // User defined Assimp config property to detect texture type from filename.
            if (m_detectTextureTypeFromFilename)
            {
                size_t posSuffix = textureRef.find_last_of(".");
                size_t posUnderscore = textureRef.find_last_of("_");

                if (posSuffix != string::npos && posUnderscore != string::npos && posSuffix > posUnderscore)
                {
                    string identifier = Ogre::ToLower(textureRef.substr(posUnderscore, posSuffix - posUnderscore));
                    ASSIMP_LOG_DEBUG_F( "Detecting texture type from filename postfix '", identifier, "'");

                    if (identifier == "_n" || identifier == "_nrm" || identifier == "_nrml" || identifier == "_normal" || identifier == "_normals" || identifier == "_normalmap")
                    {
                        textureType = aiTextureType_NORMALS;
                    }
                    else if (identifier == "_s" || identifier == "_spec" || identifier == "_specular" || identifier == "_specularmap")
                    {
                        textureType = aiTextureType_SPECULAR;
                    }
                    else if (identifier == "_l" || identifier == "_light" || identifier == "_lightmap" || identifier == "_occ" || identifier == "_occlusion")
                    {
                        textureType = aiTextureType_LIGHTMAP;
                    }
                    else if (identifier == "_disp" || identifier == "_displacement")
                    {
                        textureType = aiTextureType_DISPLACEMENT;
                    }
                    else
                    {
                        textureType = aiTextureType_DIFFUSE;
                    }
                }
                else
                {
                    textureType = aiTextureType_DIFFUSE;
                }
            }
            // Detect from texture unit name. This cannot be too broad as
            // authors might give names like "LightSaber" or "NormalNinja".
            else
            {
                string unitNameLower = Ogre::ToLower(textureUnitName);
                if (unitNameLower.find("normalmap") != string::npos)
                {
                    textureType = aiTextureType_NORMALS;
                }
                else if (unitNameLower.find("specularmap") != string::npos)
                {
                    textureType = aiTextureType_SPECULAR;
                }
                else if (unitNameLower.find("lightmap") != string::npos)
                {
                    textureType = aiTextureType_LIGHTMAP;
                }
                else if (unitNameLower.find("displacementmap") != string::npos)
                {
                    textureType = aiTextureType_DISPLACEMENT;
                }
                else
                {
                    textureType = aiTextureType_DIFFUSE;
                }
            }
        }
        else if (linePart == partTextCoordSet)
        {
            ss >> uvCoord;
        }
        /// @todo Implement
        else if(linePart == partColorOp)
        {
            /*
            ss >> linePart;
            if("replace"==linePart)//I don't think, assimp has something for this...
            {
            }
            else if("modulate"==linePart)
            {
                //TODO: set value
                //material->AddProperty(aiTextureOp_Multiply)
            }
            */
        }
    }

    if (textureRef.empty())
    {
        ASSIMP_LOG_WARN("Texture reference is empty, ignoring texture_unit.");
        return false;
    }
    if (textureType == aiTextureType_NONE)
    {
        ASSIMP_LOG_WARN("Failed to detect texture type for '" + textureRef  + "', ignoring texture_unit.");
        return false;
    }

    unsigned int textureTypeIndex = m_textures[textureType];
    m_textures[textureType]++;

    ASSIMP_LOG_DEBUG_F( "    texture '", textureRef, "' type ", textureType,
        " index ", textureTypeIndex, " UV ", uvCoord);

    aiString assimpTextureRef(textureRef);
    material->AddProperty(&assimpTextureRef, AI_MATKEY_TEXTURE(textureType, textureTypeIndex));
    material->AddProperty(&uvCoord, 1, AI_MATKEY_UVWSRC(textureType, textureTypeIndex));

    return true;
}